

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O1

unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
__thiscall jaegertracing::SpanContext::Clone(SpanContext *this)

{
  int iVar1;
  SpanContext *this_00;
  SpanContext *in_RSI;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&in_RSI->_mutex);
  if (iVar1 == 0) {
    this_00 = (SpanContext *)operator_new(0xb0);
    SpanContext(this_00,in_RSI);
    (this->super_SpanContext)._vptr_SpanContext = (_func_int **)this_00;
    pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->_mutex);
    return (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
            )(__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
              )this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::unique_ptr<opentracing::SpanContext> Clone() const noexcept override
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return std::unique_ptr<opentracing::SpanContext>(
            new SpanContext(*this));
    }